

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

bool __thiscall
libtorrent::torrent_info::parse_info_section
          (torrent_info *this,bdecode_node *info,error_code *ec,int max_pieces)

{
  bdecode_node *pbVar1;
  undefined4 uVar2;
  bool bVar3;
  type_t tVar4;
  int iVar5;
  int iVar6;
  index_type iVar7;
  char *pcVar8;
  unsigned_long uVar9;
  char *__src;
  int64_t iVar10;
  ulong uVar11;
  string *path;
  ptrdiff_t pVar12;
  string_view sVar13;
  string_view element;
  span<const_char> in;
  span<const_char> in_00;
  int *local_938;
  int *local_908;
  bool local_8e1;
  string_view local_830;
  bdecode_node local_820;
  int local_7e0;
  int local_7dc;
  undefined1 local_7d8 [8];
  bdecode_node str;
  undefined1 auStack_790 [4];
  int i_1;
  undefined1 local_780 [8];
  bdecode_node collections;
  int local_6fc;
  bdecode_node local_6f8;
  bdecode_node local_6b8;
  int local_674;
  undefined1 auStack_670 [4];
  int i;
  undefined1 local_660 [8];
  bdecode_node similar;
  bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void> local_609;
  long local_608;
  ptrdiff_t hash_offset;
  undefined1 local_5f0 [8];
  bdecode_node pieces;
  string local_5a8;
  byte local_581;
  string_view local_580;
  bdecode_node local_570;
  uchar local_52a;
  uchar local_529;
  string_view local_528;
  undefined1 local_518 [8];
  bdecode_node file_tree_node;
  undefined1 local_4c8 [8];
  bdecode_node files_node;
  file_storage v1_files;
  char *local_3c8;
  string local_3c0;
  aux *local_3a0;
  char *local_398;
  string local_390;
  string *local_370;
  char *local_368;
  undefined1 local_360 [8];
  string name;
  string_view local_338;
  bdecode_node local_328;
  string_view local_2e8;
  undefined1 local_2d8 [8];
  bdecode_node name_ent;
  file_storage files;
  int local_1d0;
  int64_t piece_length;
  char local_1b8 [8];
  char error_string [200];
  string_view local_e8;
  int local_d4;
  int iStack_d0;
  int version;
  ptrdiff_t info_offset;
  span<const_char> local_b8;
  hasher256 local_a8;
  sha256_hash local_9c;
  span<const_char> local_70;
  hasher local_60;
  sha1_hash local_54;
  undefined1 local_40 [8];
  span<const_char> section;
  int max_pieces_local;
  error_code *ec_local;
  bdecode_node *info_local;
  torrent_info *this_local;
  
  section.m_len._4_4_ = max_pieces;
  tVar4 = bdecode_node::type(info);
  if (tVar4 != dict_t) {
    boost::system::error_code::operator=(ec,torrent_info_no_dict);
    return false;
  }
  _local_40 = bdecode_node::data_section(info);
  span<char_const>::span<libtorrent::span<char_const>,char_const,void>
            ((span<char_const> *)&local_70,(span<const_char> *)local_40);
  lcrypto::hasher::hasher(&local_60,local_70);
  lcrypto::hasher::final(&local_54,&local_60);
  (this->m_info_hash).v1.m_number._M_elems[4] = local_54.m_number._M_elems[4];
  *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems = local_54.m_number._M_elems._0_8_;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = local_54.m_number._M_elems._8_8_;
  lcrypto::hasher::~hasher(&local_60);
  span<char_const>::span<libtorrent::span<char_const>,char_const,void>
            ((span<char_const> *)&local_b8,(span<const_char> *)local_40);
  lcrypto::hasher256::hasher256(&local_a8,local_b8);
  lcrypto::hasher256::final(&local_9c,&local_a8);
  *(undefined8 *)(this->m_info_hash).v2.m_number._M_elems = local_9c.m_number._M_elems._0_8_;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 2) = local_9c.m_number._M_elems._8_8_;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 4) = local_9c.m_number._M_elems._16_8_;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 6) = local_9c.m_number._M_elems._24_8_;
  lcrypto::hasher256::~hasher256(&local_a8);
  _info_offset = bdecode_node::data_section(info);
  iVar7 = span<const_char>::size((span<const_char> *)&info_offset);
  iVar5 = ::std::numeric_limits<int>::max();
  if (iVar5 <= iVar7) {
    boost::system::error_code::operator=(ec,metadata_too_large);
    return false;
  }
  bVar3 = span<const_char>::empty((span<const_char> *)local_40);
  if ((bVar3) ||
     (pcVar8 = span<const_char>::operator[]((span<const_char> *)local_40,0), *pcVar8 != 'd')) {
LAB_0073a4f5:
    boost::system::error_code::operator=(ec,invalid_bencoding);
    return false;
  }
  iVar7 = span<const_char>::size((span<const_char> *)local_40);
  pcVar8 = span<const_char>::operator[]((span<const_char> *)local_40,iVar7 + -1);
  if (*pcVar8 != 'e') goto LAB_0073a4f5;
  iVar7 = span<const_char>::size((span<const_char> *)local_40);
  this->m_info_section_size = (int32_t)iVar7;
  uVar9 = libtorrent::aux::numeric_cast<unsigned_long,int,void>(this->m_info_section_size);
  pcVar8 = (char *)operator_new__(uVar9);
  boost::shared_array<char>::reset<char>(&this->m_info_section,pcVar8);
  pcVar8 = boost::shared_array<char>::get(&this->m_info_section);
  __src = span<const_char>::data((span<const_char> *)local_40);
  uVar9 = libtorrent::aux::numeric_cast<unsigned_long,int,void>(this->m_info_section_size);
  memcpy(pcVar8,__src,uVar9);
  _iStack_d0 = bdecode_node::data_offset(info);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e8,"meta version");
  iVar10 = bdecode_node::dict_find_int_value(info,local_e8,-1);
  local_d4 = (int)iVar10;
  if (0 < local_d4) {
    span<char>::span<char,200l>((span<char> *)&piece_length,(char (*) [200])local_1b8);
    bVar3 = bdecode_node::has_soft_error(info,_piece_length);
    if (bVar3) {
      boost::system::error_code::operator=(ec,invalid_bencoding);
      return false;
    }
    if (2 < local_d4) {
      boost::system::error_code::operator=(ec,torrent_unknown_version);
      return false;
    }
  }
  if (local_d4 < 2) {
    digest32<256L>::clear(&(this->m_info_hash).v2);
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&files.m_size_on_disk,
             "piece length");
  uVar11 = bdecode_node::dict_find_int_value(info,stack0xfffffffffffffe20,-1);
  if (((long)uVar11 < 1) || (0x1fffc000 < (long)uVar11)) {
    boost::system::error_code::operator=(ec,torrent_missing_piece_length);
    return false;
  }
  if ((1 < local_d4) && (((long)uVar11 < 0x4000 || ((uVar11 & uVar11 - 1) != 0)))) {
    boost::system::error_code::operator=(ec,torrent_missing_piece_length);
    return false;
  }
  file_storage::file_storage((file_storage *)&name_ent.m_size);
  local_1d0 = (int)uVar11;
  file_storage::set_piece_length((file_storage *)&name_ent.m_size,local_1d0);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2e8,"name.utf-8");
  bdecode_node::dict_find_string((bdecode_node *)local_2d8,info,local_2e8);
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_2d8);
  if (!bVar3) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_338,"name");
    bdecode_node::dict_find_string(&local_328,info,local_338);
    bdecode_node::operator=((bdecode_node *)local_2d8,&local_328);
    bdecode_node::~bdecode_node(&local_328);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_2d8);
  if (!bVar3) {
    boost::system::error_code::operator=(ec,torrent_missing_name);
    file_storage::set_piece_length(&this->m_files,0);
    this_local._7_1_ = false;
    name.field_2._12_4_ = 1;
    goto LAB_0073ba18;
  }
  ::std::__cxx11::string::string((string *)local_360);
  sVar13 = bdecode_node::string_value((bdecode_node *)local_2d8);
  element._M_len = sVar13._M_str;
  path = (string *)sVar13._M_len;
  element._M_str = (char *)path;
  local_370 = path;
  local_368 = element._M_len;
  libtorrent::aux::sanitize_append_path_element((aux *)local_360,path,element);
  uVar11 = ::std::__cxx11::string::empty();
  if ((uVar11 & 1) != 0) {
    bVar3 = info_hash_t::has_v1(&this->m_info_hash);
    if (bVar3) {
      span<char_const>::span<libtorrent::digest32<160l>,char,void>
                ((span<char_const> *)&local_3a0,&(this->m_info_hash).v1);
      in.m_len = (difference_type)path;
      in.m_ptr = local_398;
      libtorrent::aux::to_hex_abi_cxx11_(&local_390,local_3a0,in);
      ::std::__cxx11::string::operator=((string *)local_360,(string *)&local_390);
      ::std::__cxx11::string::~string((string *)&local_390);
    }
    else {
      span<char_const>::span<libtorrent::digest32<256l>,char,void>
                ((span<char_const> *)&v1_files.m_size_on_disk,&(this->m_info_hash).v2);
      in_00.m_len = (difference_type)path;
      in_00.m_ptr = local_3c8;
      libtorrent::aux::to_hex_abi_cxx11_(&local_3c0,(aux *)v1_files.m_size_on_disk,in_00);
      ::std::__cxx11::string::operator=((string *)local_360,(string *)&local_3c0);
      ::std::__cxx11::string::~string((string *)&local_3c0);
    }
  }
  file_storage::file_storage((file_storage *)&files_node.m_size);
  if (1 < local_d4) {
    file_storage::operator=((file_storage *)&files_node.m_size,(file_storage *)&name_ent.m_size);
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&file_tree_node.m_size,"files");
  bdecode_node::dict_find_list((bdecode_node *)local_4c8,info,stack0xfffffffffffffb28);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_528,"file tree")
  ;
  bdecode_node::dict_find_dict((bdecode_node *)local_518,info,local_528);
  if ((local_d4 < 2) ||
     (bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_518), pVar12 = _iStack_d0,
     !bVar3)) {
    if (local_d4 < 2) {
      bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_518);
      if (!bVar3) goto LAB_0073aca7;
      file_storage::set_piece_length(&this->m_files,0);
      boost::system::error_code::operator=(ec,torrent_missing_meta_version);
      this_local._7_1_ = false;
      name.field_2._12_4_ = 1;
    }
    else {
      file_storage::set_piece_length(&this->m_files,0);
      boost::system::error_code::operator=(ec,torrent_missing_file_tree);
      this_local._7_1_ = false;
      name.field_2._12_4_ = 1;
    }
  }
  else {
    pcVar8 = boost::shared_array<char>::get(&this->m_info_section);
    bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_4c8);
    bVar3 = anon_unknown_1::extract_files2
                      ((bdecode_node *)local_518,(file_storage *)&name_ent.m_size,
                       (string *)local_360,pVar12,pcVar8,bVar3,0,ec);
    if (bVar3) {
      file_storage::sanitize_symlinks((file_storage *)&name_ent.m_size);
      iVar5 = file_storage::num_files((file_storage *)&name_ent.m_size);
      if (iVar5 < 2) {
        local_52a = (uchar)libtorrent::flags::
                           bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::
                           operator~(&multifile);
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::
        operator&=(&this->m_flags,
                   (bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>)local_52a
                  );
      }
      else {
        local_529 = '\x01';
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::
        operator|=(&this->m_flags,
                   (bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>)'\x01');
      }
LAB_0073aca7:
      bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_4c8);
      pVar12 = _iStack_d0;
      if (bVar3) {
        if (local_d4 == 2) {
          pbVar1 = &files_node;
        }
        else {
          pbVar1 = &name_ent;
        }
        local_938 = &pbVar1->m_size;
        pcVar8 = boost::shared_array<char>::get(&this->m_info_section);
        bVar3 = anon_unknown_1::extract_files
                          ((bdecode_node *)local_4c8,(file_storage *)local_938,(string *)local_360,
                           pVar12,pcVar8,ec);
        if (!bVar3) {
          file_storage::set_piece_length(&this->m_files,0);
          this_local._7_1_ = false;
          name.field_2._12_4_ = 1;
          goto LAB_0073b9b4;
        }
        pieces._61_1_ = '\x01';
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::
        operator|=(&this->m_flags,
                   (bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>)'\x01');
      }
      else {
        local_581 = 0;
        local_8e1 = true;
        if (1 < local_d4) {
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_580,"length");
          bdecode_node::dict_find(&local_570,info,local_580);
          local_581 = 1;
          local_8e1 = bdecode_node::operator_cast_to_bool(&local_570);
        }
        if ((local_581 & 1) != 0) {
          bdecode_node::~bdecode_node(&local_570);
        }
        if (local_8e1 == false) {
          digest32<160L>::clear(&(this->m_info_hash).v1);
        }
        else {
          if (local_d4 == 2) {
            pbVar1 = &files_node;
          }
          else {
            pbVar1 = &name_ent;
          }
          local_908 = &pbVar1->m_size;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a8,"",(allocator<char> *)&pieces.field_0x3f);
          pVar12 = _iStack_d0;
          pcVar8 = boost::shared_array<char>::get(&this->m_info_section);
          bVar3 = anon_unknown_1::extract_single_file
                            (info,(file_storage *)local_908,&local_5a8,pVar12,pcVar8,true,ec);
          ::std::__cxx11::string::~string((string *)&local_5a8);
          ::std::allocator<char>::~allocator((allocator<char> *)&pieces.field_0x3f);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            file_storage::set_piece_length(&this->m_files,0);
            this_local._7_1_ = false;
            name.field_2._12_4_ = 1;
            goto LAB_0073b9b4;
          }
          pieces._62_1_ =
               libtorrent::flags::
               bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::operator~
                         (&multifile);
          libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>
          ::operator&=(&this->m_flags,
                       (bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>)
                       pieces._62_1_);
        }
      }
      iVar5 = file_storage::num_files((file_storage *)&name_ent.m_size);
      if (iVar5 == 0) {
        boost::system::error_code::operator=(ec,no_files_in_torrent);
        file_storage::set_piece_length(&this->m_files,0);
        this_local._7_1_ = false;
        name.field_2._12_4_ = 1;
      }
      else {
        file_storage::name_abi_cxx11_((file_storage *)&name_ent.m_size);
        uVar11 = ::std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          if ((1 < local_d4) &&
             (iVar5 = file_storage::num_files((file_storage *)&files_node.m_size), 0 < iVar5)) {
            iVar5 = file_storage::num_files((file_storage *)&name_ent.m_size);
            iVar6 = file_storage::num_files((file_storage *)&files_node.m_size);
            if (iVar5 == iVar6 + 1) {
              file_storage::remove_tail_padding((file_storage *)&name_ent.m_size);
            }
            bVar3 = libtorrent::aux::files_compatible
                              ((file_storage *)&name_ent.m_size,(file_storage *)&files_node.m_size);
            if (!bVar3) {
              file_storage::set_piece_length(&this->m_files,0);
              boost::system::error_code::operator=(ec,torrent_inconsistent_files);
              this_local._7_1_ = false;
              name.field_2._12_4_ = 1;
              goto LAB_0073b9b4;
            }
          }
          iVar10 = file_storage::total_size((file_storage *)&name_ent.m_size);
          iVar5 = file_storage::piece_length((file_storage *)&name_ent.m_size);
          if (iVar10 / (long)iVar5 < 0x40000000) {
            iVar10 = file_storage::total_size((file_storage *)&name_ent.m_size);
            iVar5 = file_storage::piece_length((file_storage *)&name_ent.m_size);
            iVar6 = file_storage::piece_length((file_storage *)&name_ent.m_size);
            file_storage::set_num_pieces
                      ((file_storage *)&name_ent.m_size,
                       (int)((iVar10 + -1 + (long)iVar5) / (long)iVar6));
            iVar5 = file_storage::num_pieces((file_storage *)&name_ent.m_size);
            iVar6 = ::std::numeric_limits<int>::max();
            if ((iVar5 < iVar6 / 0x14) &&
               (iVar5 = file_storage::num_pieces((file_storage *)&name_ent.m_size),
               iVar5 <= section.m_len._4_4_)) {
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&hash_offset,"pieces");
              bdecode_node::dict_find_string((bdecode_node *)local_5f0,info,_hash_offset);
              bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_5f0);
              if (bVar3) {
                iVar5 = bdecode_node::string_length((bdecode_node *)local_5f0);
                iVar6 = file_storage::num_pieces((file_storage *)&name_ent.m_size);
                if (iVar5 == iVar6 * 0x14) {
                  pVar12 = bdecode_node::string_offset((bdecode_node *)local_5f0);
                  local_608 = pVar12 - _iStack_d0;
                  this->m_piece_hashes = (int32_t)local_608;
                  goto LAB_0073b407;
                }
                boost::system::error_code::operator=(ec,torrent_invalid_hashes);
                file_storage::set_piece_length(&this->m_files,0);
                this_local._7_1_ = false;
                name.field_2._12_4_ = 1;
              }
              else if (local_d4 < 2) {
                boost::system::error_code::operator=(ec,torrent_missing_pieces);
                file_storage::set_piece_length(&this->m_files,0);
                this_local._7_1_ = false;
                name.field_2._12_4_ = 1;
              }
              else {
LAB_0073b407:
                ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)&similar.m_size,
                           "private");
                iVar10 = bdecode_node::dict_find_int_value(info,stack0xfffffffffffff9e0,0);
                if (iVar10 == 0) {
                  libtorrent::flags::
                  bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::
                  bitfield_flag(&local_609);
                }
                else {
                  local_609.m_val = '\x02';
                }
                libtorrent::flags::
                bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::operator|=
                          (&this->m_flags,local_609);
                ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_670,"similar"
                          );
                bdecode_node::dict_find_list((bdecode_node *)local_660,info,_auStack_670);
                bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_660);
                if (bVar3) {
                  for (local_674 = 0; iVar5 = local_674,
                      iVar6 = bdecode_node::list_size((bdecode_node *)local_660), iVar5 < iVar6;
                      local_674 = local_674 + 1) {
                    bdecode_node::list_at(&local_6b8,(bdecode_node *)local_660,local_674);
                    tVar4 = bdecode_node::type(&local_6b8);
                    bdecode_node::~bdecode_node(&local_6b8);
                    if (tVar4 == string_t) {
                      bdecode_node::list_at(&local_6f8,(bdecode_node *)local_660,local_674);
                      iVar5 = bdecode_node::string_length(&local_6f8);
                      bdecode_node::~bdecode_node(&local_6f8);
                      if (iVar5 == 0x14) {
                        bdecode_node::list_at
                                  ((bdecode_node *)&collections.m_size,(bdecode_node *)local_660,
                                   local_674);
                        pVar12 = bdecode_node::string_offset((bdecode_node *)&collections.m_size);
                        local_6fc = (int)pVar12 - iStack_d0;
                        ::std::vector<int,_std::allocator<int>_>::push_back
                                  (&this->m_similar_torrents,&local_6fc);
                        bdecode_node::~bdecode_node((bdecode_node *)&collections.m_size);
                      }
                    }
                  }
                }
                ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_790,
                           "collections");
                bdecode_node::dict_find_list((bdecode_node *)local_780,info,_auStack_790);
                bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_780);
                if (bVar3) {
                  for (str._60_4_ = 0; uVar2 = str._60_4_,
                      iVar5 = bdecode_node::list_size((bdecode_node *)local_780), (int)uVar2 < iVar5
                      ; str._60_4_ = str._60_4_ + 1) {
                    bdecode_node::list_at
                              ((bdecode_node *)local_7d8,(bdecode_node *)local_780,str._60_4_);
                    tVar4 = bdecode_node::type((bdecode_node *)local_7d8);
                    if (tVar4 == string_t) {
                      pVar12 = bdecode_node::string_offset((bdecode_node *)local_7d8);
                      local_7dc = libtorrent::aux::numeric_cast<int,long,void>(pVar12 - _iStack_d0);
                      local_7e0 = bdecode_node::string_length((bdecode_node *)local_7d8);
                      ::std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                      emplace_back<int,int>
                                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                                 &this->m_collections,&local_7dc,&local_7e0);
                      name.field_2._12_4_ = 0;
                    }
                    else {
                      name.field_2._12_4_ = 0xf;
                    }
                    bdecode_node::~bdecode_node((bdecode_node *)local_7d8);
                  }
                }
                ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_830,"ssl-cert");
                bdecode_node::dict_find_string(&local_820,info,local_830);
                bVar3 = bdecode_node::operator_cast_to_bool(&local_820);
                bdecode_node::~bdecode_node(&local_820);
                if (bVar3) {
                  libtorrent::flags::
                  bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::operator|=
                            (&this->m_flags,
                             (bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>
                             )'\b');
                }
                iVar10 = file_storage::total_size((file_storage *)&name_ent.m_size);
                this_local._7_1_ = iVar10 != 0;
                if (this_local._7_1_) {
                  file_storage::swap(&this->m_files,(file_storage *)&name_ent.m_size);
                }
                else {
                  boost::system::error_code::operator=(ec,torrent_invalid_length);
                  file_storage::set_piece_length(&this->m_files,0);
                }
                name.field_2._12_4_ = 1;
                bdecode_node::~bdecode_node((bdecode_node *)local_780);
                bdecode_node::~bdecode_node((bdecode_node *)local_660);
              }
              bdecode_node::~bdecode_node((bdecode_node *)local_5f0);
            }
            else {
              boost::system::error_code::operator=(ec,too_many_pieces_in_torrent);
              file_storage::set_piece_length(&this->m_files,0);
              this_local._7_1_ = false;
              name.field_2._12_4_ = 1;
            }
          }
          else {
            boost::system::error_code::operator=(ec,too_many_pieces_in_torrent);
            file_storage::set_piece_length(&this->m_files,0);
            this_local._7_1_ = false;
            name.field_2._12_4_ = 1;
          }
        }
        else {
          boost::system::error_code::operator=(ec,torrent_missing_name);
          file_storage::set_piece_length(&this->m_files,0);
          this_local._7_1_ = false;
          name.field_2._12_4_ = 1;
        }
      }
    }
    else {
      file_storage::set_piece_length(&this->m_files,0);
      this_local._7_1_ = false;
      name.field_2._12_4_ = 1;
    }
  }
LAB_0073b9b4:
  bdecode_node::~bdecode_node((bdecode_node *)local_518);
  bdecode_node::~bdecode_node((bdecode_node *)local_4c8);
  file_storage::~file_storage((file_storage *)&files_node.m_size);
  ::std::__cxx11::string::~string((string *)local_360);
LAB_0073ba18:
  bdecode_node::~bdecode_node((bdecode_node *)local_2d8);
  file_storage::~file_storage((file_storage *)&name_ent.m_size);
  return this_local._7_1_;
}

Assistant:

bool torrent_info::parse_info_section(bdecode_node const& info
		, error_code& ec, int const max_pieces)
	{
		if (info.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_info_no_dict;
			return false;
		}

		// hash the info-field to calculate info-hash
		auto section = info.data_section();
		m_info_hash.v1 = hasher(section).final();
		m_info_hash.v2 = hasher256(section).final();
		if (info.data_section().size() >= std::numeric_limits<int>::max())
		{
			ec = errors::metadata_too_large;
			return false;
		}

		if (section.empty() || section[0] != 'd' || section[section.size() - 1] != 'e')
		{
			ec = errors::invalid_bencoding;
			return false;
		}

		// copy the info section
		m_info_section_size = int(section.size());
		m_info_section.reset(new char[aux::numeric_cast<std::size_t>(m_info_section_size)]);
		std::memcpy(m_info_section.get(), section.data(), aux::numeric_cast<std::size_t>(m_info_section_size));

		// this is the offset from the start of the torrent file buffer to the
		// info-dictionary (within the torrent file).
		// we need this because we copy just the info dictionary buffer and pull
		// out parsed data (strings) from the bdecode_node and need to make them
		// point into our copy of the buffer.
		std::ptrdiff_t const info_offset = info.data_offset();

		// check for a version key
		int const version = int(info.dict_find_int_value("meta version", -1));
		if (version > 0)
		{
			char error_string[200];
			if (info.has_soft_error(error_string))
			{
				ec = errors::invalid_bencoding;
				return false;
			}

			if (version > 2)
			{
				ec = errors::torrent_unknown_version;
				return false;
			}
		}

		if (version < 2)
		{
			// this is a v1 torrent so the v2 info hash has no meaning
			// clear it just to make sure no one tries to use it
			m_info_hash.v2.clear();
		}

		// extract piece length
		std::int64_t const piece_length = info.dict_find_int_value("piece length", -1);
		if (piece_length <= 0 || piece_length > file_storage::max_piece_size)
		{
			ec = errors::torrent_missing_piece_length;
			return false;
		}

		// according to BEP 52: "It must be a power of two and at least 16KiB."
		if (version > 1 && (piece_length < default_block_size
			|| (piece_length & (piece_length - 1)) != 0))
		{
			ec = errors::torrent_missing_piece_length;
			return false;
		}

		file_storage files;
		files.set_piece_length(static_cast<int>(piece_length));

		// extract file name (or the directory name if it's a multi file libtorrent)
		bdecode_node name_ent = info.dict_find_string("name.utf-8");
		if (!name_ent) name_ent = info.dict_find_string("name");
		if (!name_ent)
		{
			ec = errors::torrent_missing_name;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		std::string name;
		aux::sanitize_append_path_element(name, name_ent.string_value());
		if (name.empty())
		{
			if (m_info_hash.has_v1())
				name = aux::to_hex(m_info_hash.v1);
			else
				name = aux::to_hex(m_info_hash.v2);
		}

		// extract file list

		// save a copy so that we can extract both v1 and v2 files then compare the results
		file_storage v1_files;
		if (version >= 2)
			v1_files = files;

		bdecode_node const files_node = info.dict_find_list("files");

		bdecode_node file_tree_node = info.dict_find_dict("file tree");
		if (version >= 2 && file_tree_node)
		{
			if (!extract_files2(file_tree_node, files, name, info_offset
				, m_info_section.get(), bool(files_node), 0, ec))
			{
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}

			files.sanitize_symlinks();
			if (files.num_files() > 1)
				m_flags |= multifile;
			else
				m_flags &= ~multifile;
		}
		else if (version >= 2)
		{
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			ec = errors::torrent_missing_file_tree;
			return false;
		}
		else if (file_tree_node)
		{
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			ec = errors::torrent_missing_meta_version;
			return false;
		}

		if (!files_node)
		{
			// if this is a v2 torrent it is ok for the length key to be missing
			// that means it is a v2 only torrent
			if (version < 2 || info.dict_find("length"))
			{
				// if there's no list of files, there has to be a length
				// field.
				if (!extract_single_file(info, version == 2 ? v1_files : files, ""
					, info_offset, m_info_section.get(), true, ec))
				{
					// mark the torrent as invalid
					m_files.set_piece_length(0);
					return false;
				}

				m_flags &= ~multifile;
			}
			else
			{
				// this is a v2 only torrent so clear the v1 info hash to make sure no one uses it
				m_info_hash.v1.clear();
			}
		}
		else
		{
			if (!extract_files(files_node, version == 2 ? v1_files : files, name
				, info_offset, m_info_section.get(), ec))
			{
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}
			m_flags |= multifile;
		}
		if (files.num_files() == 0)
		{
			ec = errors::no_files_in_torrent;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}
		if (files.name().empty())
		{
			ec = errors::torrent_missing_name;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		// ensure hybrid torrents have compatible v1 and v2 file storages
		if (version >= 2 && v1_files.num_files() > 0)
		{
			// previous versions of libtorrent did not not create hybrid
			// torrents with "tail-padding". When loading, accept both.
			if (files.num_files() == v1_files.num_files() + 1)
			{
				files.remove_tail_padding();
			}

			if (!aux::files_compatible(files, v1_files))
			{
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				ec = errors::torrent_inconsistent_files;
				return false;
			}
		}

		// extract SHA-1 hashes for all pieces
		// we want this division to round upwards, that's why we have the
		// extra addition

		if (files.total_size() / files.piece_length() > file_storage::max_num_pieces)
		{
			ec = errors::too_many_pieces_in_torrent;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		files.set_num_pieces(int((files.total_size() + files.piece_length() - 1)
			/ files.piece_length()));

		// we expect the piece hashes to be < 2 GB in size
		if (files.num_pieces() >= std::numeric_limits<int>::max() / 20
			|| files.num_pieces() > max_pieces)
		{
			ec = errors::too_many_pieces_in_torrent;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		bdecode_node const pieces = info.dict_find_string("pieces");
		if (!pieces)
		{
			if (version < 2)
			{
				ec = errors::torrent_missing_pieces;
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}
		}
		else
		{
			if (pieces.string_length() != files.num_pieces() * 20)
			{
				ec = errors::torrent_invalid_hashes;
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}

			std::ptrdiff_t const hash_offset = pieces.string_offset() - info_offset;
			TORRENT_ASSERT(hash_offset < std::numeric_limits<std::int32_t>::max());
			TORRENT_ASSERT(hash_offset >= 0);
			m_piece_hashes = static_cast<std::int32_t>(hash_offset);
			TORRENT_ASSERT(m_piece_hashes > 0);
			TORRENT_ASSERT(m_piece_hashes < m_info_section_size);
		}

		m_flags |= (info.dict_find_int_value("private", 0) != 0)
			? private_torrent : torrent_info_flags_t{};

#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		bdecode_node const similar = info.dict_find_list("similar");
		if (similar)
		{
			for (int i = 0; i < similar.list_size(); ++i)
			{
				if (similar.list_at(i).type() != bdecode_node::string_t)
					continue;

				if (similar.list_at(i).string_length() != 20)
					continue;
				m_similar_torrents.push_back(static_cast<std::int32_t>(
					similar.list_at(i).string_offset() - info_offset));
			}
		}

		bdecode_node const collections = info.dict_find_list("collections");
		if (collections)
		{
			for (int i = 0; i < collections.list_size(); ++i)
			{
				bdecode_node const str = collections.list_at(i);

				if (str.type() != bdecode_node::string_t) continue;

				m_collections.emplace_back(
					aux::numeric_cast<std::int32_t>(str.string_offset() - info_offset)
					, str.string_length());
			}
		}
#endif // TORRENT_DISABLE_MUTABLE_TORRENTS

		if (info.dict_find_string("ssl-cert"))
			m_flags |= ssl_torrent;

		if (files.total_size() == 0)
		{
			ec = errors::torrent_invalid_length;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		// now, commit the files structure we just parsed out
		// into the torrent_info object.
		m_files.swap(files);

		TORRENT_ASSERT(m_info_hash.has_v2() == m_files.v2());
		return true;
	}